

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
pstore::romfs::romfs::dir_to_string_abi_cxx11_
          (error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,romfs *this,not_null<const_pstore::romfs::directory_*> dir)

{
  bool bVar1;
  directory *pdVar2;
  value_type *__name;
  not_null<const_pstore::romfs::directory_*> in_R8;
  anon_class_16_2_633b73ba f;
  undefined1 local_60 [32];
  romfs *local_40;
  pointer_based_iterator<const_pstore::romfs::dirent> local_38;
  pointer_based_iterator<const_pstore::romfs::dirent> local_30;
  iterator parent_de;
  romfs *this_local;
  not_null<const_pstore::romfs::directory_*> dir_local;
  
  this_local = (romfs *)dir.ptr_;
  dir_local.ptr_ = (directory *)__return_storage_ptr__;
  parent_de.pos_ = (pointer)pstore::gsl::not_null::operator_cast_to_directory_((not_null *)this);
  bVar1 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::operator==
                    ((not_null<const_pstore::romfs::directory_*> *)&this_local,
                     (directory **)&parent_de);
  if (bVar1) {
    error_or<std::__cxx11::string>::error_or<char_const(&)[2],void>
              ((error_or<std::__cxx11::string> *)__return_storage_ptr__,(char (*) [2])0x214a44);
  }
  else {
    pdVar2 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::operator->
                       ((not_null<const_pstore::romfs::directory_*> *)&this_local);
    local_30.pos_ = (pointer)directory::find<3ul>(pdVar2,(char (*) [3])0x21ae5f);
    pdVar2 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::operator->
                       ((not_null<const_pstore::romfs::directory_*> *)&this_local);
    local_38.pos_ = (pointer)directory::end(pdVar2);
    bVar1 = pointer_based_iterator<pstore::romfs::dirent_const>::operator!=
                      ((pointer_based_iterator<pstore::romfs::dirent_const> *)&local_30,&local_38);
    if (!bVar1) {
      assert_failed("parent_de != dir->end () && \"All directories must contain a \'..\' entry\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                    ,0x168);
    }
    local_40 = this_local;
    local_60._24_8_ = this;
    __name = pointer_based_iterator<const_pstore::romfs::dirent>::operator->(&local_30);
    dirent::opendir((dirent *)local_60,(char *)__name);
    f.dir.ptr_ = in_R8.ptr_;
    f.this = local_40;
    pstore::operator>>=(__return_storage_ptr__,(pstore *)local_60,
                        (error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                        local_60._24_8_,f);
    error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or
              ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<std::string> romfs::dir_to_string (not_null<directory const *> const dir) const {
            if (dir == root_) {
                return error_or<std::string>{"/"};
            }
            auto const parent_de = dir->find ("..");
            PSTORE_ASSERT (parent_de != dir->end () && "All directories must contain a '..' entry");
            return parent_de->opendir () >>=
                   [this, dir] (not_null<directory const *> const parent) {
                       return this->dir_to_string (parent) >>= [dir, parent] (std::string s) {
                           PSTORE_ASSERT (s.length () > 0);
                           if (s.back () != '/') {
                               s += '/';
                           }

                           auto const p = parent->find (dir);
                           PSTORE_ASSERT (p != dir->end ());
                           return error_or<std::string> (s.append (p->name ().get ()));
                       };
                   };
        }